

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void adjust_unstable_region_bounds(FIRSTPASS_STATS *stats,REGIONS *regions,int *num_regions)

{
  int iVar1;
  REGION_TYPES RVar2;
  int *in_RDX;
  REGIONS *in_RSI;
  FIRSTPASS_STATS *in_RDI;
  int coeff_close_1;
  int coded_small_1;
  int intra_close_1;
  int count_grad_1;
  int count_coded_1;
  int counti_1;
  int lasti_1;
  int starti_1;
  double avg_intra_err_1;
  int coeff_close;
  int coded_small;
  int intra_close;
  int count_grad;
  int count_coded;
  int counti;
  int lasti;
  int starti;
  double avg_intra_err;
  int k;
  int j;
  int i;
  REGIONS *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  REGION_TYPES in_stack_ffffffffffffff64;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  REGIONS *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  int local_68;
  int local_64;
  double local_58;
  int local_40;
  int local_3c;
  double local_30;
  int local_24;
  int local_20;
  int local_1c;
  
  remove_short_regions
            ((REGIONS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  remove_short_regions
            ((REGIONS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  get_region_stats((FIRSTPASS_STATS *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,0);
  local_24 = 0;
  do {
    if (*in_RDX <= local_24) {
      cleanup_regions((REGIONS *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      &in_stack_ffffffffffffff58->start);
      remove_short_regions
                ((REGIONS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      get_region_stats((FIRSTPASS_STATS *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,0);
      local_24 = 0;
      while( true ) {
        RVar2 = in_stack_ffffffffffffff64 & 0xffffff;
        if (local_24 < *in_RDX) {
          RVar2 = CONCAT13(1 < *in_RDX,(int3)in_stack_ffffffffffffff64);
        }
        in_stack_ffffffffffffff64 = RVar2;
        if ((char)(in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
        if (((((in_RSI[local_24].type != STABLE_REGION) ||
              (0xd < (in_RSI[local_24].last - in_RSI[local_24].start) + 1)) || (local_24 < 1)) ||
            ((in_RSI[local_24].avg_coded_err <= in_RSI[local_24 + -1].avg_coded_err * 1.01 &&
             (in_RSI[local_24 + -1].avg_cor_coeff * 0.999 <= in_RSI[local_24].avg_cor_coeff)))) ||
           ((*in_RDX + -1 <= local_24 ||
            ((in_RSI[local_24].avg_coded_err <= in_RSI[local_24 + 1].avg_coded_err * 1.01 &&
             (in_RSI[local_24 + 1].avg_cor_coeff * 0.999 <= in_RSI[local_24].avg_cor_coeff)))))) {
          if ((((in_RSI[local_24].type != HIGH_VAR_REGION) ||
               (((0xd < (in_RSI[local_24].last - in_RSI[local_24].start) + 1 || (local_24 < 1)) ||
                ((in_RSI[local_24 + -1].avg_coded_err * 0.99 <= in_RSI[local_24].avg_coded_err &&
                 (in_RSI[local_24].avg_cor_coeff <= in_RSI[local_24 + -1].avg_cor_coeff * 1.001)))))
               ) || (*in_RDX + -1 <= local_24)) ||
             ((in_RSI[local_24 + 1].avg_coded_err * 0.99 <= in_RSI[local_24].avg_coded_err &&
              (in_RSI[local_24].avg_cor_coeff <= in_RSI[local_24 + 1].avg_cor_coeff * 1.001)))) {
            local_24 = local_24 + 1;
          }
          else {
            remove_region(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                          (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
            analyze_region(in_RDI,local_24 + -1,in_RSI);
          }
        }
        else {
          remove_region(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                        (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
          analyze_region(in_RDI,local_24 + -1,in_RSI);
        }
      }
      remove_short_regions
                ((REGIONS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      remove_short_regions
                ((REGIONS *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
      return;
    }
    if (in_RSI[local_24].type != STABLE_REGION) {
      if (0 < local_24) {
        local_30 = 0.0;
        if (in_RSI[local_24 + -1].start + 1 < in_RSI[local_24 + -1].last + -6) {
          in_stack_ffffffffffffff84 = in_RSI[local_24 + -1].last + -6;
        }
        else {
          in_stack_ffffffffffffff84 = in_RSI[local_24 + -1].start + 1;
        }
        local_3c = 0;
        for (local_1c = in_stack_ffffffffffffff84; local_1c <= in_RSI[local_24 + -1].last;
            local_1c = local_1c + 1) {
          local_30 = in_RDI[local_1c].intra_error + local_30;
          local_3c = local_3c + 1;
        }
        if (0 < local_3c) {
          if (local_30 / (double)local_3c <= 0.001) {
            in_stack_ffffffffffffff78 = (REGIONS *)0x3f50624dd2f1a9fc;
          }
          else {
            in_stack_ffffffffffffff78 = (REGIONS *)(local_30 / (double)local_3c);
          }
          local_40 = 0;
          iVar1 = in_RSI[local_24 + -1].last;
          while (local_20 = iVar1 + 1, local_20 <= in_RSI[local_24].last) {
            if ((in_RDI[local_20].cor_coeff <= 0.995) ||
               (0.1 <= in_RDI[local_20].coded_error / (double)in_stack_ffffffffffffff78)) {
              local_40 = local_40 + -1;
            }
            if ((0.1 <= ABS(in_RDI[local_20].intra_error - (double)in_stack_ffffffffffffff78) /
                        (double)in_stack_ffffffffffffff78) || (local_40 < 0)) break;
            in_RSI[local_24 + -1].last = local_20;
            in_RSI[local_24].start = iVar1 + 2;
            iVar1 = local_20;
          }
        }
      }
      if (local_24 < *in_RDX + -1) {
        local_58 = 0.0;
        if (in_RSI[local_24 + 1].last + -1 < in_RSI[local_24 + 1].start + 6) {
          in_stack_ffffffffffffff74 = in_RSI[local_24 + 1].last + -1;
        }
        else {
          in_stack_ffffffffffffff74 = in_RSI[local_24 + 1].start + 6;
        }
        local_64 = 0;
        for (local_1c = in_RSI[local_24 + 1].start; local_1c <= in_stack_ffffffffffffff74;
            local_1c = local_1c + 1) {
          local_58 = in_RDI[local_1c].intra_error + local_58;
          local_64 = local_64 + 1;
        }
        if (0 < local_64) {
          if (local_58 / (double)local_64 <= 0.001) {
            in_stack_ffffffffffffff68 = (int *)0x3f50624dd2f1a9fc;
          }
          else {
            in_stack_ffffffffffffff68 = (int *)(local_58 / (double)local_64);
          }
          local_68 = 1;
          iVar1 = in_RSI[local_24 + 1].start;
          while (local_20 = iVar1 + -1, in_RSI[local_24].start <= local_20) {
            if ((in_RDI[local_20].cor_coeff <= 0.995) ||
               (0.1 <= in_RDI[iVar1].coded_error / (double)in_stack_ffffffffffffff68)) {
              local_68 = local_68 + -1;
            }
            if ((0.1 <= ABS(in_RDI[local_20].intra_error - (double)in_stack_ffffffffffffff68) /
                        (double)in_stack_ffffffffffffff68) || (local_68 < 0)) break;
            in_RSI[local_24 + 1].start = local_20;
            in_RSI[local_24].last = iVar1 + -2;
            iVar1 = local_20;
          }
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void adjust_unstable_region_bounds(const FIRSTPASS_STATS *stats,
                                          REGIONS *regions, int *num_regions) {
  int i, j, k;
  // Remove regions that are too short. Likely noise.
  remove_short_regions(regions, num_regions, STABLE_REGION, HALF_WIN);
  remove_short_regions(regions, num_regions, HIGH_VAR_REGION, HALF_WIN);

  get_region_stats(stats, regions, *num_regions);

  // Adjust region boundaries. The thresholds are empirically obtained, but
  // overall the performance is not very sensitive to small changes to them.
  for (k = 0; k < *num_regions; k++) {
    if (regions[k].type == STABLE_REGION) continue;
    if (k > 0) {
      // Adjust previous boundary.
      // First find the average intra/coded error in the previous
      // neighborhood.
      double avg_intra_err = 0;
      const int starti = AOMMAX(regions[k - 1].last - WINDOW_SIZE + 1,
                                regions[k - 1].start + 1);
      const int lasti = regions[k - 1].last;
      int counti = 0;
      for (i = starti; i <= lasti; i++) {
        avg_intra_err += stats[i].intra_error;
        counti++;
      }
      if (counti > 0) {
        avg_intra_err = AOMMAX(avg_intra_err / (double)counti, 0.001);
        int count_coded = 0, count_grad = 0;
        for (j = lasti + 1; j <= regions[k].last; j++) {
          const int intra_close =
              fabs(stats[j].intra_error - avg_intra_err) / avg_intra_err < 0.1;
          const int coded_small = stats[j].coded_error / avg_intra_err < 0.1;
          const int coeff_close = stats[j].cor_coeff > 0.995;
          if (!coeff_close || !coded_small) count_coded--;
          if (intra_close && count_coded >= 0 && count_grad >= 0) {
            // this frame probably belongs to the previous stable region
            regions[k - 1].last = j;
            regions[k].start = j + 1;
          } else {
            break;
          }
        }
      }
    }  // if k > 0
    if (k < *num_regions - 1) {
      // Adjust next boundary.
      // First find the average intra/coded error in the next neighborhood.
      double avg_intra_err = 0;
      const int starti = regions[k + 1].start;
      const int lasti = AOMMIN(regions[k + 1].last - 1,
                               regions[k + 1].start + WINDOW_SIZE - 1);
      int counti = 0;
      for (i = starti; i <= lasti; i++) {
        avg_intra_err += stats[i].intra_error;
        counti++;
      }
      if (counti > 0) {
        avg_intra_err = AOMMAX(avg_intra_err / (double)counti, 0.001);
        // At the boundary, coded error is large, but still the frame is stable
        int count_coded = 1, count_grad = 1;
        for (j = starti - 1; j >= regions[k].start; j--) {
          const int intra_close =
              fabs(stats[j].intra_error - avg_intra_err) / avg_intra_err < 0.1;
          const int coded_small =
              stats[j + 1].coded_error / avg_intra_err < 0.1;
          const int coeff_close = stats[j].cor_coeff > 0.995;
          if (!coeff_close || !coded_small) count_coded--;
          if (intra_close && count_coded >= 0 && count_grad >= 0) {
            // this frame probably belongs to the next stable region
            regions[k + 1].start = j;
            regions[k].last = j - 1;
          } else {
            break;
          }
        }
      }
    }  // if k < *num_regions - 1
  }    // end of loop over all regions

  cleanup_regions(regions, num_regions);
  remove_short_regions(regions, num_regions, HIGH_VAR_REGION, HALF_WIN);
  get_region_stats(stats, regions, *num_regions);

  // If a stable regions has higher error than neighboring high var regions,
  // or if the stable region has a lower average correlation,
  // then it should be merged with them
  k = 0;
  while (k < *num_regions && (*num_regions) > 1) {
    if (regions[k].type == STABLE_REGION &&
        (regions[k].last - regions[k].start + 1) < 2 * WINDOW_SIZE &&
        ((k > 0 &&  // previous regions
          (regions[k].avg_coded_err > regions[k - 1].avg_coded_err * 1.01 ||
           regions[k].avg_cor_coeff < regions[k - 1].avg_cor_coeff * 0.999)) &&
         (k < *num_regions - 1 &&  // next region
          (regions[k].avg_coded_err > regions[k + 1].avg_coded_err * 1.01 ||
           regions[k].avg_cor_coeff < regions[k + 1].avg_cor_coeff * 0.999)))) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
      analyze_region(stats, k - 1, regions);
    } else if (regions[k].type == HIGH_VAR_REGION &&
               (regions[k].last - regions[k].start + 1) < 2 * WINDOW_SIZE &&
               ((k > 0 &&  // previous regions
                 (regions[k].avg_coded_err <
                      regions[k - 1].avg_coded_err * 0.99 ||
                  regions[k].avg_cor_coeff >
                      regions[k - 1].avg_cor_coeff * 1.001)) &&
                (k < *num_regions - 1 &&  // next region
                 (regions[k].avg_coded_err <
                      regions[k + 1].avg_coded_err * 0.99 ||
                  regions[k].avg_cor_coeff >
                      regions[k + 1].avg_cor_coeff * 1.001)))) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
      analyze_region(stats, k - 1, regions);
    } else {
      k++;
    }
  }

  remove_short_regions(regions, num_regions, STABLE_REGION, WINDOW_SIZE);
  remove_short_regions(regions, num_regions, HIGH_VAR_REGION, HALF_WIN);
}